

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

timespec __thiscall absl::lts_20250127::ToTimespec(lts_20250127 *this,Duration d)

{
  __time_t _Var1;
  uint uVar2;
  uint uVar4;
  timespec tVar5;
  timespec tVar6;
  __syscall_slong_t _Var3;
  
  uVar4 = d.rep_hi_.lo_;
  if (uVar4 == 0xffffffff) {
    _Var1 = -0x8000000000000000;
    if (-1 < (long)this) {
      _Var1 = 0x7fffffffffffffff;
    }
    _Var3 = 999999999;
    if (-1 >= (long)this) {
      _Var3 = 0;
    }
    tVar5.tv_nsec = _Var3;
    tVar5.tv_sec = _Var1;
    return tVar5;
  }
  uVar2 = uVar4;
  if (((long)this < 0) && (uVar2 = uVar4 + 3, 3999999999 < uVar2)) {
    this = this + 1;
    uVar2 = uVar4 + 0x1194d803;
  }
  tVar6.tv_nsec._0_4_ = uVar2 >> 2;
  tVar6.tv_sec = (__time_t)this;
  tVar6.tv_nsec._4_4_ = 0;
  return tVar6;
}

Assistant:

timespec ToTimespec(Duration d) {
  timespec ts;
  if (!time_internal::IsInfiniteDuration(d)) {
    int64_t rep_hi = time_internal::GetRepHi(d);
    uint32_t rep_lo = time_internal::GetRepLo(d);
    if (rep_hi < 0) {
      // Tweak the fields so that unsigned division of rep_lo
      // maps to truncation (towards zero) for the timespec.
      rep_lo += kTicksPerNanosecond - 1;
      if (rep_lo >= kTicksPerSecond) {
        rep_hi += 1;
        rep_lo -= kTicksPerSecond;
      }
    }
    ts.tv_sec = static_cast<decltype(ts.tv_sec)>(rep_hi);
    if (ts.tv_sec == rep_hi) {  // no time_t narrowing
      ts.tv_nsec = rep_lo / kTicksPerNanosecond;
      return ts;
    }
  }
  if (d >= ZeroDuration()) {
    ts.tv_sec = std::numeric_limits<time_t>::max();
    ts.tv_nsec = 1000 * 1000 * 1000 - 1;
  } else {
    ts.tv_sec = std::numeric_limits<time_t>::min();
    ts.tv_nsec = 0;
  }
  return ts;
}